

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,false>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 left;
  undefined4 left_00;
  undefined4 left_01;
  unsigned_long *puVar1;
  ulong uVar2;
  timestamp_t tVar3;
  timestamp_t *ptVar4;
  timestamp_t *ptVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  int64_t *local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &rdata->micros;
      iVar9 = 0;
      iVar6 = count;
      do {
        left_01 = ((interval_t *)(local_70 + -1))->months;
        right_01.micros = iVar6;
        right_01._0_8_ = *local_70;
        tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)(uint)ldata[iVar9].days,(date_t)left_01,right_01);
        result_data[iVar9].value = tVar3.value;
        iVar9 = iVar9 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    ptVar4 = (timestamp_t *)0x0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
LAB_01440d9c:
        uVar8 = uVar10;
        if (uVar10 < uVar7) {
          piVar11 = &rdata[uVar10].micros;
          ptVar5 = ptVar4;
          do {
            left = ((interval_t *)(piVar11 + -1))->months;
            right.micros = (int64_t)ptVar5;
            right._0_8_ = *piVar11;
            tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                              ((AddOperator *)(ulong)(uint)ldata[uVar10].days,(date_t)left,right);
            result_data[uVar10].value = tVar3.value;
            uVar10 = uVar10 + 1;
            piVar11 = piVar11 + 2;
            uVar8 = uVar7;
          } while (uVar7 != uVar10);
        }
      }
      else {
        uVar2 = puVar1[(long)ptVar4];
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_01440d9c;
          uVar8 = uVar10;
          if (uVar10 < uVar7) {
            piVar11 = &rdata[uVar10].micros;
            uVar12 = 0;
            ptVar5 = ptVar4;
            do {
              if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
                left_00 = ((interval_t *)(piVar11 + -1))->months;
                right_00.micros = (int64_t)ptVar5;
                right_00._0_8_ = *piVar11;
                tVar3 = AddOperator::
                        Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                  ((AddOperator *)(ulong)(uint)ldata[uVar10 + uVar12].days,
                                   (date_t)left_00,right_00);
                (result_data + uVar10)[uVar12].value = tVar3.value;
                ptVar5 = result_data + uVar10;
              }
              uVar12 = uVar12 + 1;
              piVar11 = piVar11 + 2;
              uVar8 = uVar7;
            } while (uVar7 - uVar10 != uVar12);
          }
        }
      }
      ptVar4 = (timestamp_t *)((long)&ptVar4->value + 1);
      uVar10 = uVar8;
    } while (ptVar4 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}